

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O2

void av1_cost_tokens_from_cdf(int *costs,aom_cdf_prob *cdf,int *inv_map)

{
  aom_cdf_prob aVar1;
  int iVar2;
  long lVar3;
  aom_cdf_prob p15;
  long lVar4;
  short sVar5;
  short sVar6;
  
  lVar4 = 0;
  sVar5 = 0;
  do {
    aVar1 = cdf[lVar4];
    sVar6 = -0x8000 - aVar1;
    p15 = sVar6 - sVar5;
    if (p15 < 5) {
      p15 = 4;
    }
    iVar2 = av1_cost_symbol(p15);
    lVar3 = lVar4;
    if (inv_map != (int *)0x0) {
      lVar3 = (long)inv_map[lVar4];
    }
    costs[lVar3] = iVar2;
    lVar4 = lVar4 + 1;
    sVar5 = sVar6;
  } while (aVar1 != 0);
  return;
}

Assistant:

void av1_cost_tokens_from_cdf(int *costs, const aom_cdf_prob *cdf,
                              const int *inv_map) {
  int i;
  aom_cdf_prob prev_cdf = 0;
  for (i = 0;; ++i) {
    aom_cdf_prob p15 = AOM_ICDF(cdf[i]) - prev_cdf;
    p15 = (p15 < EC_MIN_PROB) ? EC_MIN_PROB : p15;
    prev_cdf = AOM_ICDF(cdf[i]);

    if (inv_map)
      costs[inv_map[i]] = av1_cost_symbol(p15);
    else
      costs[i] = av1_cost_symbol(p15);

    // Stop once we reach the end of the CDF
    if (cdf[i] == AOM_ICDF(CDF_PROB_TOP)) break;
  }
}